

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarEnv.cpp
# Opt level: O0

void __thiscall VarEnv::assignVar(VarEnv *this,string *name,Data *data)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>
  local_58;
  _Self local_30;
  _Self local_28;
  iterator search;
  Data *data_local;
  string *name_local;
  VarEnv *this_local;
  
  search._M_node = (_Base_ptr)data;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
       ::find(&this->vars,name);
  Data::cite((Data *)search._M_node);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
       ::end(&this->vars);
  bVar2 = std::operator!=(&local_28,&local_30);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>
             ::operator->(&local_28);
    Data::uncite(ppVar3->second);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>
             ::operator->(&local_28);
    Data::check(ppVar3->second);
    iVar1 = search;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>
             ::operator->(&local_28);
    ppVar3->second = (Data *)iVar1._M_node;
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>::
    pair<Data_*&,_true>(&local_58,name,(Data **)&search);
    std::
    map<std::__cxx11::string,Data*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
    ::insert<std::pair<std::__cxx11::string,Data*>>
              ((map<std::__cxx11::string,Data*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
                *)this,&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>::
    ~pair(&local_58);
  }
  return;
}

Assistant:

void VarEnv::assignVar(const std::string &name, Data *data) {
    auto search = vars.find(name);
    data->cite();
    if (search != vars.end()) {
        (search->second)->uncite();
        Data::check(search->second);
        search->second = data;
    } else {
        vars.insert(std::pair<std::string, Data *>(name, data));
    }
}